

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * wasm::Path::getBaseName(string *__return_storage_ptr__,string *path)

{
  bool bVar1;
  reference pcVar2;
  long lVar3;
  size_type sep;
  char c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_50;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  string *path_local;
  
  getAllPathSeparators_abi_cxx11_();
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_50._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb0);
    if (!bVar1) {
      sep._4_4_ = 2;
LAB_01f8b2ed:
      std::__cxx11::string::~string((string *)&__begin2);
      if (sep._4_4_ != 1) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
      }
      return __return_storage_ptr__;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    lVar3 = std::__cxx11::string::rfind((char)path,(ulong)(uint)(int)*pcVar2);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
      sep._4_4_ = 1;
      goto LAB_01f8b2ed;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::string getBaseName(const std::string& path) {
  for (char c : getAllPathSeparators()) {
    auto sep = path.rfind(c);
    if (sep != std::string::npos) {
      return path.substr(sep + 1);
    }
  }
  return path;
}